

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__load_gif_main_outofmem(stbi__gif *g,stbi_uc *out,int **delays)

{
  long *in_RDX;
  void *in_RSI;
  long in_RDI;
  
  free(*(void **)(in_RDI + 8));
  free(*(void **)(in_RDI + 0x18));
  free(*(void **)(in_RDI + 0x10));
  if (in_RSI != (void *)0x0) {
    free(in_RSI);
  }
  if ((in_RDX != (long *)0x0) && (*in_RDX != 0)) {
    free((void *)*in_RDX);
  }
  stbi__err("outofmem");
  return (void *)0x0;
}

Assistant:

static void *stbi__load_gif_main_outofmem(stbi__gif *g, stbi_uc *out, int **delays)
{
   STBI_FREE(g->out);
   STBI_FREE(g->history);
   STBI_FREE(g->background);

   if (out) STBI_FREE(out);
   if (delays && *delays) STBI_FREE(*delays);
   return stbi__errpuc("outofmem", "Out of memory");
}